

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode copy_noInit(void *src,void *dst,UA_DataType *type)

{
  UA_DataTypeMember *pUVar1;
  UA_StatusCode UVar2;
  uint uVar3;
  ulong uVar4;
  UA_DataType *pUVar5;
  size_t size;
  UA_DataType *type_00;
  size_t *dst_size;
  size_t *psVar6;
  size_t *psVar7;
  UA_DataType *typelists [2];
  
  typelists[1] = (UA_DataType *)((ulong)type->membersSize << 4);
  uVar3 = 0;
  for (pUVar5 = (UA_DataType *)0x0; typelists[1] != pUVar5;
      pUVar5 = (UA_DataType *)&(pUVar5->typeId).identifier) {
    pUVar1 = type->members;
    typelists[0] = type + -(ulong)type->typeIndex;
    type_00 = typelists[(ulong)(~(uint)(byte)(&pUVar1->field_0xb)[(long)pUVar5] & 1) - 1] +
              *(ushort *)((long)&pUVar1->memberTypeIndex + (long)pUVar5);
    psVar7 = (size_t *)((long)src + (ulong)(&pUVar1->padding)[(long)pUVar5]);
    psVar6 = (size_t *)((long)dst + (ulong)(&pUVar1->padding)[(long)pUVar5]);
    if (((&pUVar1->field_0xb)[(long)pUVar5] & 2) == 0) {
      uVar4 = 0x19;
      if ((type_00->field_0x25 & 1) != 0) {
        uVar4 = (ulong)type_00->typeIndex;
      }
      UVar2 = (*copyJumpTable[uVar4])(psVar7,psVar6,type_00);
      uVar3 = UVar2 | uVar3;
      uVar4 = (ulong)type_00->memSize;
    }
    else {
      size = *psVar7;
      UVar2 = UA_Array_copy((void *)psVar7[1],size,(void **)(psVar6 + 1),type_00);
      uVar3 = UVar2 | uVar3;
      if (uVar3 != 0) {
        size = 0;
      }
      *psVar6 = size;
      uVar4 = 0x10;
    }
    src = (void *)((long)psVar7 + uVar4);
    dst = (void *)((long)psVar6 + uVar4);
  }
  return uVar3;
}

Assistant:

static UA_StatusCode
copy_noInit(const void *src, void *dst, const UA_DataType *type) {
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    uintptr_t ptrs = (uintptr_t)src;
    uintptr_t ptrd = (uintptr_t)dst;
    UA_Byte membersSize = type->membersSize;
    for(size_t i = 0; i < membersSize; ++i) {
        const UA_DataTypeMember *m= &type->members[i];
        const UA_DataType *typelists[2] = { UA_TYPES, &type[-type->typeIndex] };
        const UA_DataType *mt = &typelists[!m->namespaceZero][m->memberTypeIndex];
        if(!m->isArray) {
            ptrs += m->padding;
            ptrd += m->padding;
            size_t fi = mt->builtin ? mt->typeIndex : UA_BUILTIN_TYPES_COUNT;
            retval |= copyJumpTable[fi]((const void*)ptrs, (void*)ptrd, mt);
            ptrs += mt->memSize;
            ptrd += mt->memSize;
        } else {
            ptrs += m->padding;
            ptrd += m->padding;
            size_t *dst_size = (size_t*)ptrd;
            const size_t size = *((const size_t*)ptrs);
            ptrs += sizeof(size_t);
            ptrd += sizeof(size_t);
            retval |= UA_Array_copy(*(void* const*)ptrs, size, (void**)ptrd, mt);
            if(retval == UA_STATUSCODE_GOOD)
                *dst_size = size;
            else
                *dst_size = 0;
            ptrs += sizeof(void*);
            ptrd += sizeof(void*);
        }
    }
    return retval;
}